

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

int __thiscall glcts::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestSubcase *pTVar1;
  
  context = (this->super_TestCaseGroup).m_context;
  glcts::(anonymous_namespace)::currentLog = context->m_testCtx->m_log;
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,context,"api-enums",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::GatherEnumsTest>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"gather-glsl-compile",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::GatherGLSLCompile>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-int-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherInt2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-uint-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherUint2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-depth-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherDepth2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-int-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherInt2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-uint-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherUint2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-depth-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherDepth2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-cube-rgba",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloatCube>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-int-cube-rgba",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherIntCube>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-uint-cube",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherUintCube>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-depth-cube",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherDepthCube>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-float-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherFloat2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-int-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherInt2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-uint-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherUint2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-depth-2d",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherDepth2D>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-float-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherFloat2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-int-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherInt2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-uint-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherUint2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-depth-2darray",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherDepth2DArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"swizzle",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::Swizzle>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"base-level",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BaseLevel>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"incomplete-texture",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::IncompleteTexture>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"incomplete-texture-last-comp",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::IncompleteTextureLastComp>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"triangle-draw",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::TriangleDraw>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-2d-srgb",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2DSrgb>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-2d-srgb-alpha",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2DSrgbAlpha>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-2d-rgb",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2DRgb>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-2d-rg",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2DRg>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"plain-gather-float-2d-r",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2DR>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-float-2d-rgb",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherFloat2DRgb>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-float-2d-rg",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherFloat2DRg>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"offset-gather-float-2d-r",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::OffsetGatherFloat2DR>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TextureGatherTests::init()
{
	using namespace glcts;
	setOutput(m_context.getTestContext().getLog());
	addChild(new TestSubcase(m_context, "api-enums", TestSubcase::Create<GatherEnumsTest>));
	addChild(new TestSubcase(m_context, "gather-glsl-compile", TestSubcase::Create<GatherGLSLCompile>));
	addChild(new TestSubcase(m_context, "plain-gather-float-2d", TestSubcase::Create<PlainGatherFloat2D>));
	addChild(new TestSubcase(m_context, "plain-gather-int-2d", TestSubcase::Create<PlainGatherInt2D>));
	addChild(new TestSubcase(m_context, "plain-gather-uint-2d", TestSubcase::Create<PlainGatherUint2D>));
	addChild(new TestSubcase(m_context, "plain-gather-depth-2d", TestSubcase::Create<PlainGatherDepth2D>));
	addChild(new TestSubcase(m_context, "plain-gather-float-2darray", TestSubcase::Create<PlainGatherFloat2DArray>));
	addChild(new TestSubcase(m_context, "plain-gather-int-2darray", TestSubcase::Create<PlainGatherInt2DArray>));
	addChild(new TestSubcase(m_context, "plain-gather-uint-2darray", TestSubcase::Create<PlainGatherUint2DArray>));
	addChild(new TestSubcase(m_context, "plain-gather-depth-2darray", TestSubcase::Create<PlainGatherDepth2DArray>));
	addChild(new TestSubcase(m_context, "plain-gather-float-cube-rgba", TestSubcase::Create<PlainGatherFloatCube>));
	addChild(new TestSubcase(m_context, "plain-gather-int-cube-rgba", TestSubcase::Create<PlainGatherIntCube>));
	addChild(new TestSubcase(m_context, "plain-gather-uint-cube", TestSubcase::Create<PlainGatherUintCube>));
	addChild(new TestSubcase(m_context, "plain-gather-depth-cube", TestSubcase::Create<PlainGatherDepthCube>));
	addChild(new TestSubcase(m_context, "offset-gather-float-2d", TestSubcase::Create<OffsetGatherFloat2D>));
	addChild(new TestSubcase(m_context, "offset-gather-int-2d", TestSubcase::Create<OffsetGatherInt2D>));
	addChild(new TestSubcase(m_context, "offset-gather-uint-2d", TestSubcase::Create<OffsetGatherUint2D>));
	addChild(new TestSubcase(m_context, "offset-gather-depth-2d", TestSubcase::Create<OffsetGatherDepth2D>));
	addChild(new TestSubcase(m_context, "offset-gather-float-2darray", TestSubcase::Create<OffsetGatherFloat2DArray>));
	addChild(new TestSubcase(m_context, "offset-gather-int-2darray", TestSubcase::Create<OffsetGatherInt2DArray>));
	addChild(new TestSubcase(m_context, "offset-gather-uint-2darray", TestSubcase::Create<OffsetGatherUint2DArray>));
	addChild(new TestSubcase(m_context, "offset-gather-depth-2darray", TestSubcase::Create<OffsetGatherDepth2DArray>));
	addChild(new TestSubcase(m_context, "swizzle", TestSubcase::Create<Swizzle>));
	addChild(new TestSubcase(m_context, "base-level", TestSubcase::Create<BaseLevel>));
	addChild(new TestSubcase(m_context, "incomplete-texture", TestSubcase::Create<IncompleteTexture>));
	addChild(
		new TestSubcase(m_context, "incomplete-texture-last-comp", TestSubcase::Create<IncompleteTextureLastComp>));
	addChild(new TestSubcase(m_context, "triangle-draw", TestSubcase::Create<TriangleDraw>));
	addChild(new TestSubcase(m_context, "plain-gather-float-2d-srgb", TestSubcase::Create<PlainGatherFloat2DSrgb>));
	addChild(new TestSubcase(m_context, "plain-gather-float-2d-srgb-alpha",
							 TestSubcase::Create<PlainGatherFloat2DSrgbAlpha>));
	addChild(new TestSubcase(m_context, "plain-gather-float-2d-rgb", TestSubcase::Create<PlainGatherFloat2DRgb>));
	addChild(new TestSubcase(m_context, "plain-gather-float-2d-rg", TestSubcase::Create<PlainGatherFloat2DRg>));
	addChild(new TestSubcase(m_context, "plain-gather-float-2d-r", TestSubcase::Create<PlainGatherFloat2DR>));
	addChild(new TestSubcase(m_context, "offset-gather-float-2d-rgb", TestSubcase::Create<OffsetGatherFloat2DRgb>));
	addChild(new TestSubcase(m_context, "offset-gather-float-2d-rg", TestSubcase::Create<OffsetGatherFloat2DRg>));
	addChild(new TestSubcase(m_context, "offset-gather-float-2d-r", TestSubcase::Create<OffsetGatherFloat2DR>));
}